

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode urlencode_str(dynbuf *o,char *url,size_t len,_Bool relative,_Bool query)

{
  ulong uVar1;
  CURLcode CVar2;
  ulong in_RAX;
  char *pcVar3;
  CURLUcode CVar4;
  undefined7 in_register_00000009;
  bool bVar5;
  size_t len_00;
  byte *pbVar6;
  bool bVar7;
  undefined4 uStack_38;
  uchar out [3];
  
  CVar2 = CURLE_OK;
  _uStack_38 = in_RAX;
  if ((int)CONCAT71(in_register_00000009,relative) == 0) {
    pcVar3 = strstr(url,"//");
    pbVar6 = (byte *)(pcVar3 + 2);
    if (pcVar3 == (char *)0x0) {
      pbVar6 = (byte *)url;
    }
    len_00 = (long)pbVar6 - (long)url;
    while ((0x3f < (ulong)*pbVar6 || ((0x8000800000000001U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0))) {
      pbVar6 = pbVar6 + 1;
      len_00 = len_00 + 1;
    }
    CVar2 = Curl_dyn_addn(o,url,len_00);
    len = len - len_00;
    url = (char *)pbVar6;
  }
  bVar5 = !query;
  while ((bVar7 = len != 0, len = len - 1, bVar7 && (CVar2 == CURLE_OK))) {
    if (*url == 0x20) {
      if (bVar5) {
        CVar2 = Curl_dyn_addn(o,"%20",3);
        bVar5 = true;
      }
      else {
        CVar2 = Curl_dyn_addn(o,"+",1);
        bVar5 = false;
      }
    }
    else if ((byte)(*url + 0x81U) < 0xa1) {
      uVar1 = _uStack_38 >> 0x30;
      _uStack_38 = CONCAT24(0x25,uStack_38);
      _uStack_38 = CONCAT26((short)uVar1,_uStack_38) & 0xff00ffffffffffff;
      Curl_hexbyte(out + 1,*url,true);
      CVar2 = Curl_dyn_addn(o,out,3);
    }
    else {
      CVar2 = Curl_dyn_addn(o,url,1);
      bVar5 = (bool)(*url != 0x3fU & bVar5);
    }
    url = (char *)((byte *)url + 1);
  }
  CVar4 = CURLUE_OUT_OF_MEMORY;
  if (CVar2 == CURLE_TOO_LARGE) {
    CVar4 = CURLUE_TOO_LARGE;
  }
  if (CVar2 == CURLE_OK) {
    CVar4 = CURLUE_OK;
  }
  return CVar4;
}

Assistant:

static CURLUcode urlencode_str(struct dynbuf *o, const char *url,
                               size_t len, bool relative,
                               bool query)
{
  /* we must add this with whitespace-replacing */
  bool left = !query;
  const unsigned char *iptr;
  const unsigned char *host_sep = (const unsigned char *) url;
  CURLcode result = CURLE_OK;

  if(!relative) {
    size_t n;
    host_sep = (const unsigned char *) find_host_sep(url);

    /* output the first piece as-is */
    n = (const char *)host_sep - url;
    result = Curl_dyn_addn(o, url, n);
    len -= n;
  }

  for(iptr = host_sep; len && !result; iptr++, len--) {
    if(*iptr == ' ') {
      if(left)
        result = Curl_dyn_addn(o, "%20", 3);
      else
        result = Curl_dyn_addn(o, "+", 1);
    }
    else if((*iptr < ' ') || (*iptr >= 0x7f)) {
      unsigned char out[3]={'%'};
      Curl_hexbyte(&out[1], *iptr, TRUE);
      result = Curl_dyn_addn(o, out, 3);
    }
    else {
      result = Curl_dyn_addn(o, iptr, 1);
      if(*iptr == '?')
        left = FALSE;
    }
  }

  if(result)
    return cc2cu(result);
  return CURLUE_OK;
}